

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_to_autobuf(autobuf *abuf,netaddr *src)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = netaddr_get_af_maxprefix((uint)src->_type);
  if (bVar1 < 8) {
    return -1;
  }
  iVar2 = abuf_memcpy(abuf,src,(ulong)(bVar1 >> 3));
  return iVar2;
}

Assistant:

int
netaddr_to_autobuf(struct autobuf *abuf, const struct netaddr *src) {
  uint32_t addr_len;

  addr_len = netaddr_get_maxprefix(src) >> 3;
  if (addr_len == 0) {
    /* unknown address type */
    return -1;
  }

  return abuf_memcpy(abuf, src->_addr, addr_len);
}